

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_codecs.c
# Opt level: O0

cram_codec *
cram_byte_array_stop_encode_init(cram_stats *st,cram_external_type option,void *dat,int version)

{
  cram_codec *c;
  int version_local;
  void *dat_local;
  cram_external_type option_local;
  cram_stats *st_local;
  
  st_local = (cram_stats *)malloc(0x240);
  if (st_local == (cram_stats *)0x0) {
    st_local = (cram_stats *)0x0;
  }
  else {
    st_local->freqs[0] = 5;
    *(code **)(st_local->freqs + 4) = cram_byte_array_stop_encode_free;
    *(code **)(st_local->freqs + 8) = cram_byte_array_stop_encode;
    *(code **)(st_local->freqs + 10) = cram_byte_array_stop_encode_store;
    *(char *)(st_local->freqs + 0xc) = (char)*dat;
    st_local->freqs[0xd] = *(int *)((long)dat + 4);
  }
  return (cram_codec *)st_local;
}

Assistant:

cram_codec *cram_byte_array_stop_encode_init(cram_stats *st,
					     enum cram_external_type option,
					     void *dat,
					     int version) {
    cram_codec *c;

    c = malloc(sizeof(*c));
    if (!c)
	return NULL;
    c->codec = E_BYTE_ARRAY_STOP;
    c->free = cram_byte_array_stop_encode_free;
    c->encode = cram_byte_array_stop_encode;
    c->store = cram_byte_array_stop_encode_store;

    c->e_byte_array_stop.stop = ((int *)dat)[0];
    c->e_byte_array_stop.content_id = ((int *)dat)[1];

    return c;
}